

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts5FlushSecureDelete(Fts5Index *p,Fts5Structure *pStruct,char *zTerm,int nTerm,i64 iRowid)

{
  int *pRc;
  uint iSegid;
  Fts5Config *pFVar1;
  ushort *pData;
  Fts5StructureSegment *pFVar2;
  ushort *pData_00;
  u8 *puVar3;
  sqlite3_stmt *pStmt_00;
  u32 uVar4;
  byte bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  char *zSql;
  void *__dest;
  long lVar14;
  Fts5Data *pFVar15;
  ushort uVar16;
  u8 *__src;
  size_t sVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  Fts5Config *pConfig;
  ulong uVar21;
  int iKeyOff;
  uint uVar22;
  uint uVar23;
  Fts5SegIter *pFVar24;
  long lVar25;
  uint uVar26;
  long lVar27;
  size_t __n;
  Fts5Iter *pIter_00;
  int iVar28;
  uint uVar29;
  long in_FS_OFFSET;
  bool bVar30;
  int local_d8;
  int local_d4;
  uchar *local_90;
  Fts5Iter *pIter;
  int nSuffix2;
  int nPrefix2;
  int nPos;
  undefined4 uStack_4c;
  sqlite3_stmt *pStmt;
  u32 local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pIter = (Fts5Iter *)0x0;
  pFVar1 = p->pConfig;
  if (pFVar1->iVersion != 5) {
    pStmt = (sqlite3_stmt *)0x0;
    zSql = sqlite3_mprintf("REPLACE INTO %Q.\'%q_config\' VALUES (\'version\', %d)",pFVar1->zDb,
                           pFVar1->zName);
    fts5IndexPrepareStmt(p,&pStmt,zSql);
    pStmt_00 = pStmt;
    if (p->rc == 0) {
      sqlite3_step(pStmt);
      iVar6 = sqlite3_finalize(pStmt_00);
      if (p->rc == 0) {
        p->rc = iVar6;
      }
      pFVar1->iCookie = pFVar1->iCookie + 1;
      pFVar1->iVersion = 5;
    }
  }
  fts5MultiIterNew(p,pStruct,0x40,(Fts5Colset *)0x0,(u8 *)zTerm,nTerm,-1,0,&pIter);
  pIter_00 = pIter;
  pRc = &p->rc;
  if ((((p->rc != 0) || ((pIter->base).bEof != '\0')) ||
      ((pIter->aSeg[pIter->aFirst[1].iFirst].iRowid < iRowid &&
       (fts5MultiIterNextFrom(p,pIter,iRowid), p->rc != 0)))) || ((pIter_00->base).bEof != '\0'))
  goto LAB_001e6709;
  uVar16 = pIter_00->aFirst[1].iFirst;
  if (pIter_00->aSeg[uVar16].iRowid != iRowid) goto LAB_001e6709;
  iVar6 = p->pConfig->eDetail;
  pFVar15 = pIter_00->aSeg[uVar16].pLeaf;
  iSegid = (pIter_00->aSeg[uVar16].pSeg)->iSegid;
  pData = (ushort *)pFVar15->p;
  iVar9 = pFVar15->nn;
  uVar20 = pFVar15->szLeaf;
  pStmt = (sqlite3_stmt *)0x0;
  iVar28 = iVar9 - uVar20;
  __dest = sqlite3Fts5MallocZero(pRc,(long)(iVar28 + 0x10));
  if (p->rc != 0) goto LAB_001e6709;
  pFVar24 = pIter_00->aSeg + uVar16;
  memcpy(__dest,(void *)((long)(int)uVar20 + (long)pData),(long)iVar28);
  lVar14 = (long)pFVar24->iLeafPgno;
  if (pFVar24->iLeafPgno == pFVar24->iTermLeafPgno) {
    uVar29 = pFVar24->iTermLeafOffset;
  }
  else {
    uVar29 = (uint)(ushort)(*pData << 8 | *pData >> 8);
  }
  bVar5 = sqlite3Fts5GetVarint((uchar *)((long)pData + (long)(int)uVar29),(u64 *)&pStmt);
  uVar26 = uVar29 + bVar5;
  lVar25 = (long)(int)uVar26;
  if (iVar6 == 1) {
    lVar27 = pFVar24->iLeafOffset;
    if (lVar25 < lVar27) {
      do {
        bVar30 = *(char *)((long)pData + lVar25) == '\0';
        uVar29 = uVar26 + bVar30 +
                 (uint)(*(char *)((long)pData + (long)(int)(uVar26 + bVar30)) == '\0');
        bVar5 = sqlite3Fts5GetVarint((uchar *)((long)pData + (long)(int)uVar29),(u64 *)&pStmt);
        uVar26 = uVar29 + bVar5;
        lVar25 = (long)(int)uVar26;
      } while (lVar25 < lVar27);
    }
    if ((int)uVar26 < pFVar24->iEndofDoclist) {
      uVar26 = uVar26 + (*(char *)((long)pData + lVar25) == '\0');
    }
    if ((int)uVar26 < pFVar24->iEndofDoclist) {
      uVar26 = uVar26 + (*(char *)((long)pData + (long)(int)uVar26) == '\0');
    }
  }
  else {
    _nPos = _nPos & 0xffffffff00000000;
    iVar6 = sqlite3Fts5GetVarint32((uchar *)((long)pData + lVar25),(u32 *)&nPos);
    lVar25 = pFVar24->iLeafOffset;
    for (iVar6 = uVar26 + iVar6; iVar6 < lVar25; iVar6 = uVar29 + bVar5 + iVar6) {
      uVar29 = nPos / 2 + iVar6;
      bVar5 = sqlite3Fts5GetVarint((uchar *)((long)pData + (long)(int)uVar29),(u64 *)&pStmt);
      iVar6 = sqlite3Fts5GetVarint32
                        ((uchar *)((long)pData + (long)(int)(uVar29 + bVar5)),(u32 *)&nPos);
    }
    uVar26 = (int)lVar25 + pFVar24->nPos;
  }
  bVar30 = false;
  if ((int)uVar20 <= (int)uVar26) {
    if (p->rc == 0) {
      pFVar2 = pFVar24->pSeg;
      iVar6 = p->pConfig->eDetail;
      do {
        lVar14 = lVar14 + 1;
        if (pFVar2->pgnoLast < lVar14) break;
        lVar25 = ((ulong)(uint)pFVar2->iSegid << 0x25) + lVar14;
        pFVar15 = fts5DataRead(p,lVar25);
        if (pFVar15 == (Fts5Data *)0x0) {
          bVar30 = true;
          goto LAB_001e6231;
        }
        pData_00 = (ushort *)pFVar15->p;
        uVar16 = *pData_00 << 8 | *pData_00 >> 8;
        uVar26 = (uint)uVar16;
        _nPos = CONCAT44(uStack_4c,(uint)uVar16);
        if (uVar16 != 0) {
          bVar30 = false;
LAB_001e619a:
          if (iVar6 == 1) goto LAB_001e6231;
          iVar6 = pFVar15->szLeaf;
          if (((iVar6 <= (int)uVar26) || ((int)uVar26 < 4)) || (iVar7 = pFVar15->nn, iVar7 < iVar6))
          {
            *pRc = 0x10b;
            goto LAB_001e6231;
          }
          if (iVar7 - iVar6 == 0 || iVar7 < iVar6) {
            uVar22 = 0;
            local_90 = (uchar *)0x0;
          }
          else {
            local_3c = 0;
            iVar10 = sqlite3Fts5GetVarint32((uchar *)((long)iVar6 + (long)pData_00),&local_3c);
            uVar4 = local_3c;
            if ((int)local_3c < (int)uVar26) {
              *pRc = 0x10b;
              goto LAB_001e6231;
            }
            local_90 = (uchar *)sqlite3Fts5MallocZero(pRc,(long)((iVar7 - iVar6) + 2));
            if (local_90 == (uchar *)0x0) goto LAB_001e6231;
            iVar10 = iVar10 + iVar6;
            uVar22 = sqlite3Fts5PutVarint(local_90,(long)(int)(uVar4 - (uVar26 - 4)));
            iVar6 = pFVar15->nn - iVar10;
            if (iVar6 != 0 && iVar10 <= pFVar15->nn) {
              memcpy(local_90 + (int)uVar22,(void *)((long)iVar10 + (long)pData_00),(long)iVar6);
              uVar22 = (uVar22 - iVar10) + pFVar15->nn;
            }
            iVar6 = pFVar15->szLeaf;
          }
          iVar6 = iVar6 - (uVar26 - 4);
          memmove(pData_00 + 2,(void *)((ulong)uVar26 + (long)pData_00),(long)(iVar6 + -4));
          pData_00[1] = (ushort)iVar6 << 8 | (ushort)iVar6 >> 8;
          if (*(char *)((long)pData_00 + 1) != '\0' || (char)*pData_00 != '\0') {
            *pData_00 = 0x400;
          }
          if (0 < (int)uVar22) {
            memcpy((void *)((long)iVar6 + (long)pData_00),local_90,(ulong)uVar22);
            iVar6 = iVar6 + uVar22;
          }
          sqlite3_free(local_90);
          fts5DataWrite(p,lVar25,(u8 *)pData_00,iVar6);
          goto LAB_001e6231;
        }
        if (pFVar15->szLeaf != pFVar15->nn) {
          sqlite3Fts5GetVarint32((uchar *)((long)pFVar15->szLeaf + (long)pData_00),(u32 *)&nPos);
          if (nPos != 0) {
            bVar30 = true;
            uVar26 = nPos;
            goto LAB_001e619a;
          }
        }
        local_3c = 0x4000000;
        if (iVar6 != 1) {
          fts5DataWrite(p,lVar25,(u8 *)&local_3c,4);
        }
        sqlite3_free(pFVar15);
      } while (*pRc == 0);
    }
    bVar30 = true;
    pFVar15 = (Fts5Data *)0x0;
LAB_001e6231:
    sqlite3_free(pFVar15);
    uVar26 = uVar20;
  }
  if (pFVar24->bDel != '\0') {
LAB_001e624d:
    iVar7 = sqlite3Fts5PutVarint((uchar *)((long)(int)uVar29 + (long)pData),(u64)pStmt);
    iVar6 = iVar7 + uVar29;
    uVar29 = uVar29 + iVar7 + 1;
    *(undefined1 *)((long)pData + (long)iVar6) = 1;
    uVar19 = 0;
    uVar22 = uVar26;
    goto LAB_001e659f;
  }
  if ((0 < iVar28) && (uVar26 != uVar20)) {
    uVar21 = 0;
    uVar22 = 0;
    do {
      _nPos = _nPos & 0xffffffff00000000;
      iVar6 = sqlite3Fts5GetVarint32((uchar *)(uVar21 + (long)__dest),(u32 *)&nPos);
      uVar19 = (int)uVar21 + iVar6;
      uVar21 = (ulong)uVar19;
      uVar22 = uVar22 + nPos;
      if (uVar22 == uVar26) {
        bVar30 = true;
      }
    } while ((int)uVar19 < iVar28);
  }
  uVar22 = uVar20;
  if (uVar29 == (ushort)(*pData << 8 | *pData >> 8)) {
    if ((uVar26 == uVar20) || (bVar30)) {
      *pData = 0;
      if (pFVar24->bDel != '\0') goto LAB_001e624d;
      goto LAB_001e6320;
    }
LAB_001e639c:
    if (uVar26 != uVar20) {
      _nPos = 0;
      bVar5 = sqlite3Fts5GetVarint((uchar *)((long)(int)uVar26 + (long)pData),(u64 *)&nPos);
      iVar6 = sqlite3Fts5PutVarint((uchar *)((long)(int)uVar29 + (long)pData),(u64)(pStmt + _nPos));
      uVar29 = iVar6 + uVar29;
      uVar22 = bVar5 + uVar26;
    }
LAB_001e6591:
    uVar19 = 0;
  }
  else {
LAB_001e6320:
    if (!bVar30) goto LAB_001e639c;
    lVar14 = (long)pFVar24->iLeafPgno;
    if ((pFVar24->iLeafPgno != pFVar24->iTermLeafPgno) || (uVar29 != pFVar24->iTermLeafOffset)) {
      uVar22 = uVar26;
      if (uVar29 == 4) {
        lVar27 = (ulong)iSegid << 0x25;
        lVar25 = lVar14 << 0x20;
        do {
          lVar25 = lVar25 + -0x100000000;
          lVar14 = lVar14 + -1;
          if ((lVar14 <= pFVar24->iTermLeafPgno) ||
             (pFVar15 = fts5DataRead(p,lVar27 + lVar14), pFVar15 == (Fts5Data *)0x0)) break;
          iVar6 = pFVar15->nn;
          sqlite3_free(pFVar15);
        } while (iVar6 == 4);
        uVar29 = 4;
        if (pFVar24->iTermLeafPgno == (int)lVar14) {
          lVar27 = (lVar25 >> 0x20) + lVar27;
          pFVar15 = fts5DataRead(p,lVar27);
          if (pFVar15 != (Fts5Data *)0x0) {
            iVar6 = pFVar15->szLeaf;
            if (iVar6 == pFVar24->iTermLeafOffset) {
              puVar3 = pFVar15->p;
              __src = puVar3 + iVar6;
              iVar7 = pFVar15->nn;
              iVar10 = 0;
              sVar17 = 0;
              do {
                __n = sVar17;
                _nPos = _nPos & 0xffffffff00000000;
                iVar8 = sqlite3Fts5GetVarint32(__src + __n,(u32 *)&nPos);
                iVar10 = iVar10 + nPos;
                uVar22 = (int)__n + iVar8;
                sVar17 = (ulong)uVar22;
              } while ((int)uVar22 < iVar7 - iVar6);
              memmove(puVar3 + iVar10,__src,__n);
              *(ushort *)(pFVar15->p + 2) = (ushort)iVar10 << 8 | (ushort)iVar10 >> 8;
              fts5DataWrite(p,lVar27,pFVar15->p,iVar10 + (int)__n);
              if (__n == 0) {
                fts5SecureDeleteIdxEntry(p,iSegid,pFVar24->iTermLeafPgno);
              }
            }
          }
          sqlite3_free(pFVar15);
        }
        uVar19 = 0;
        uVar22 = uVar26;
        goto LAB_001e659f;
      }
      goto LAB_001e6591;
    }
    if (iVar28 < 1) {
      bVar30 = false;
      uVar29 = 0;
    }
    else {
      uVar23 = 0;
      iVar6 = 0;
      uVar19 = 0;
      do {
        _nPos = _nPos & 0xffffffff00000000;
        iVar7 = sqlite3Fts5GetVarint32((uchar *)((ulong)uVar23 + (long)__dest),(u32 *)&nPos);
        uVar18 = nPos + uVar19;
        if (uVar29 < uVar18) break;
        uVar23 = uVar23 + iVar7;
        iVar6 = iVar6 + 1;
        uVar19 = uVar18;
      } while ((int)uVar23 < iVar28);
      bVar30 = iVar6 == 1;
      uVar29 = uVar19;
    }
    uVar19 = uVar29;
    if (uVar26 != uVar20) {
      _nPos = _nPos & 0xffffffff00000000;
      nPrefix2 = 0;
      nSuffix2 = 0;
      iVar7 = sqlite3Fts5GetVarint32((uchar *)((long)(int)uVar26 + (long)pData),(u32 *)&nPrefix2);
      iVar10 = sqlite3Fts5GetVarint32
                         ((uchar *)((long)(int)(iVar7 + uVar26) + (long)pData),(u32 *)&nSuffix2);
      iVar6 = 0;
      uVar22 = uVar29;
      if (!bVar30) {
        iVar6 = sqlite3Fts5GetVarint32((uchar *)((long)(int)uVar29 + (long)pData),(u32 *)&nPos);
        uVar22 = iVar6 + uVar29;
        iVar6 = nPos;
      }
      uVar23 = iVar7 + uVar26 + iVar10;
      iVar11 = sqlite3Fts5GetVarint32((uchar *)((long)pData + (long)(int)uVar22),&local_3c);
      iVar8 = nPrefix2;
      iVar10 = nSuffix2;
      iVar7 = nPrefix2;
      if (iVar6 < nPrefix2) {
        iVar7 = iVar6;
      }
      sVar17 = (size_t)nSuffix2;
      iVar12 = nPrefix2 - iVar7;
      iVar13 = iVar12 + nSuffix2;
      uVar19 = uVar26;
      if (((int)uVar20 < (int)(uVar22 + iVar11 + iVar13)) ||
         (uVar22 = nSuffix2 + uVar23, (int)uVar20 < (int)uVar22)) {
        *pRc = 0x10b;
        uVar22 = uVar23;
      }
      else {
        if (!bVar30) {
          iVar11 = sqlite3Fts5PutVarint((uchar *)((long)(int)uVar29 + (long)pData),(long)iVar7);
          uVar29 = uVar29 + iVar11;
        }
        iVar11 = sqlite3Fts5PutVarint((uchar *)((long)pData + (long)(int)uVar29),(long)iVar13);
        iVar11 = uVar29 + iVar11;
        if ((pFVar24->term).n < iVar8) {
          *pRc = 0x10b;
        }
        else if (iVar6 < iVar8) {
          memcpy((void *)((long)pData + (long)iVar11),(pFVar24->term).p + iVar7,(long)iVar12);
          iVar11 = iVar11 + iVar12;
        }
        memmove((void *)((long)pData + (long)iVar11),(void *)((long)(int)uVar23 + (long)pData),
                sVar17);
        uVar29 = iVar11 + iVar10;
      }
    }
  }
LAB_001e659f:
  if (*pRc == 0) {
    memmove((void *)((long)(int)uVar29 + (long)pData),(void *)((long)(int)uVar22 + (long)pData),
            (long)(int)(iVar9 - uVar22));
    iVar6 = uVar20 - (uVar22 - uVar29);
    pData[1] = (ushort)iVar6 << 8 | (ushort)iVar6 >> 8;
    if (iVar28 < 1) {
LAB_001e66c9:
      iVar28 = pFVar24->iLeafPgno;
      local_d8 = iVar6;
    }
    else {
      uVar20 = 0;
      local_d4 = 0;
      uVar21 = 0;
      local_d8 = iVar6;
      do {
        _nPos = _nPos & 0xffffffff00000000;
        iVar9 = sqlite3Fts5GetVarint32((uchar *)(uVar21 + (long)__dest),(u32 *)&nPos);
        uVar20 = uVar20 + nPos;
        if (uVar20 != uVar19) {
          iVar7 = 0;
          if ((int)uVar29 < (int)uVar20) {
            iVar7 = uVar22 - uVar29;
          }
          iVar10 = sqlite3Fts5PutVarint
                             ((uchar *)((long)pData + (long)local_d8),
                              (long)(int)((uVar20 - iVar7) - local_d4));
          local_d8 = local_d8 + iVar10;
          local_d4 = uVar20 - iVar7;
        }
        uVar26 = (int)uVar21 + iVar9;
        uVar21 = (ulong)uVar26;
      } while ((int)uVar26 < iVar28);
      iVar9 = pFVar24->iLeafPgno;
      iVar28 = iVar9;
      if ((iVar6 == local_d8) && (iVar28 = 1, local_d8 = iVar6, iVar9 != 1)) {
        fts5SecureDeleteIdxEntry(p,iSegid,iVar9);
        goto LAB_001e66c9;
      }
    }
    fts5DataWrite(p,(long)iVar28 + ((ulong)iSegid << 0x25),(u8 *)pData,local_d8);
  }
  sqlite3_free(__dest);
  pIter_00 = pIter;
LAB_001e6709:
  fts5MultiIterFree(pIter_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return *pRc;
  }
  __stack_chk_fail();
}

Assistant:

static int fts5FlushSecureDelete(
  Fts5Index *p,
  Fts5Structure *pStruct,
  const char *zTerm,
  int nTerm,
  i64 iRowid
){
  const int f = FTS5INDEX_QUERY_SKIPHASH;
  Fts5Iter *pIter = 0;            /* Used to find term instance */

  /* If the version number has not been set to SECUREDELETE, do so now. */
  if( p->pConfig->iVersion!=FTS5_CURRENT_VERSION_SECUREDELETE ){
    Fts5Config *pConfig = p->pConfig;
    sqlite3_stmt *pStmt = 0;
    fts5IndexPrepareStmt(p, &pStmt, sqlite3_mprintf(
          "REPLACE INTO %Q.'%q_config' VALUES ('version', %d)",
          pConfig->zDb, pConfig->zName, FTS5_CURRENT_VERSION_SECUREDELETE
    ));
    if( p->rc==SQLITE_OK ){
      int rc;
      sqlite3_step(pStmt);
      rc = sqlite3_finalize(pStmt);
      if( p->rc==SQLITE_OK ) p->rc = rc;
      pConfig->iCookie++;
      pConfig->iVersion = FTS5_CURRENT_VERSION_SECUREDELETE;
    }
  }

  fts5MultiIterNew(p, pStruct, f, 0, (const u8*)zTerm, nTerm, -1, 0, &pIter);
  if( fts5MultiIterEof(p, pIter)==0 ){
    i64 iThis = fts5MultiIterRowid(pIter);
    if( iThis<iRowid ){
      fts5MultiIterNextFrom(p, pIter, iRowid);
    }

    if( p->rc==SQLITE_OK
     && fts5MultiIterEof(p, pIter)==0
     && iRowid==fts5MultiIterRowid(pIter)
    ){
      Fts5SegIter *pSeg = &pIter->aSeg[pIter->aFirst[1].iFirst];
      fts5DoSecureDelete(p, pSeg);
    }
  }

  fts5MultiIterFree(pIter);
  return p->rc;
}